

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbs.c
# Opt level: O0

int cbs_set_trace(CBS_HANDLE cbs,_Bool trace_on)

{
  LOGGER_LOG p_Var1;
  LOGGER_LOG l;
  int result;
  _Bool trace_on_local;
  CBS_HANDLE cbs_local;
  
  if (cbs == (CBS_HANDLE)0x0) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/cbs.c",
                "cbs_set_trace",0x30d,1,"NULL cbs handle");
    }
    l._0_4_ = 0x30e;
  }
  else {
    amqp_management_set_trace(cbs->amqp_management,trace_on);
    l._0_4_ = 0;
  }
  return (int)l;
}

Assistant:

int cbs_set_trace(CBS_HANDLE cbs, bool trace_on)
{
    int result;

    if (cbs == NULL)
    {
        /* Codes_SRS_CBS_01_090: [ If the argument `cbs` is NULL, `cbs_set_trace` shall fail and return a non-zero value. ]*/
        LogError("NULL cbs handle");
        result = MU_FAILURE;
    }
    else
    {
        /* Codes_SRS_CBS_01_088: [ `cbs_set_trace` shall enable or disable tracing by calling `amqp_management_set_trace` to pass down the `trace_on` value. ]*/
        amqp_management_set_trace(cbs->amqp_management, trace_on);

        /* Codes_SRS_CBS_01_089: [ On success, `cbs_set_trace` shall return 0. ]*/
        result = 0;
    }

    return result;
}